

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_remove_(map_base_t *m,char *key)

{
  map_node_t *__ptr;
  map_node_t **ppmVar1;
  
  ppmVar1 = map_getref(m,key);
  if (ppmVar1 != (map_node_t **)0x0) {
    __ptr = *ppmVar1;
    *ppmVar1 = __ptr->next;
    free(__ptr);
    m->nnodes = m->nnodes - 1;
  }
  return;
}

Assistant:

void map_remove_(map_base_t *m, const char *key) {
  map_node_t *node;
  map_node_t **next = map_getref(m, key);
  if (next) {
    node = *next;
    *next = (*next)->next;
    free(node);
    m->nnodes--;
  }
}